

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O0

Vec_Int_t * Wlc_NtkFindUifableMultiplierPairs(Wlc_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pObj_00;
  Wlc_Obj_t *pObj2_00;
  undefined4 local_40;
  undefined4 local_3c;
  int k;
  int i;
  Wlc_Obj_t *pObj2;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vPairs;
  Vec_Int_t *vMultis;
  Wlc_Ntk_t *p_local;
  
  p_00 = Wlc_NtkCollectMultipliers(p);
  p_local = (Wlc_Ntk_t *)Vec_IntAlloc(2);
  local_3c = 0;
  do {
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 <= local_3c) {
      Vec_IntFree(p_00);
      iVar1 = Vec_IntSize((Vec_Int_t *)p_local);
      if (iVar1 < 1) {
        Vec_IntFree((Vec_Int_t *)p_local);
        p_local = (Wlc_Ntk_t *)0x0;
      }
      return (Vec_Int_t *)p_local;
    }
    iVar1 = Vec_IntEntry(p_00,local_3c);
    pObj_00 = Wlc_NtkObj(p,iVar1);
    for (local_40 = 0; iVar1 = Vec_IntSize(p_00), local_40 < iVar1; local_40 = local_40 + 1) {
      iVar1 = Vec_IntEntry(p_00,local_40);
      pObj2_00 = Wlc_NtkObj(p,iVar1);
      if (local_40 == local_3c) break;
      iVar1 = Wlc_NtkPairIsUifable(p,pObj_00,pObj2_00);
      if (iVar1 != 0) {
        iVar1 = Wlc_ObjId(p,pObj_00);
        Vec_IntPush((Vec_Int_t *)p_local,iVar1);
        iVar1 = Wlc_ObjId(p,pObj2_00);
        Vec_IntPush((Vec_Int_t *)p_local,iVar1);
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkFindUifableMultiplierPairs( Wlc_Ntk_t * p )
{
    Vec_Int_t * vMultis = Wlc_NtkCollectMultipliers( p );
    Vec_Int_t * vPairs = Vec_IntAlloc( 2 );
    Wlc_Obj_t * pObj, * pObj2;  int i, k;
    // iterate through unique pairs
    Wlc_NtkForEachObjVec( vMultis, p, pObj, i )
        Wlc_NtkForEachObjVec( vMultis, p, pObj2, k )
        {
            if ( k == i )  
                break;
            if ( Wlc_NtkPairIsUifable( p, pObj, pObj2 ) )
            {
                Vec_IntPush( vPairs, Wlc_ObjId(p, pObj) );
                Vec_IntPush( vPairs, Wlc_ObjId(p, pObj2) );
            }
        }
    Vec_IntFree( vMultis );
    if ( Vec_IntSize( vPairs ) > 0 )
        return vPairs;
    Vec_IntFree( vPairs );
    return NULL;
}